

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

bool __thiscall
ON_Annotation::Internal_ReadAnnotation(ON_Annotation *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  AnnotationType AVar2;
  bool bVar3;
  int iVar4;
  ON_TextContent *this_00;
  AnnotationType AVar5;
  long lVar6;
  undefined1 *puVar7;
  ON_Plane *pOVar8;
  AnnotationType *pAVar9;
  ON_Plane *pOVar10;
  ulong uVar11;
  AnnotationType *pAVar12;
  byte bVar13;
  int content_version;
  uint u;
  
  bVar13 = 0;
  Internal_Destroy(this);
  (this->m_dimstyle_id).Data1 = 0;
  (this->m_dimstyle_id).Data2 = 0;
  (this->m_dimstyle_id).Data3 = 0;
  (this->m_dimstyle_id).Data4[0] = '\0';
  (this->m_dimstyle_id).Data4[1] = '\0';
  (this->m_dimstyle_id).Data4[2] = '\0';
  (this->m_dimstyle_id).Data4[3] = '\0';
  (this->m_dimstyle_id).Data4[4] = '\0';
  (this->m_dimstyle_id).Data4[5] = '\0';
  (this->m_dimstyle_id).Data4[6] = '\0';
  (this->m_dimstyle_id).Data4[7] = '\0';
  pOVar8 = &ON_Plane::World_xy;
  pOVar10 = &this->m_plane;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pOVar10->origin).x = (pOVar8->origin).x;
    pOVar8 = (ON_Plane *)((long)pOVar8 + ((ulong)bVar13 * -2 + 1) * 8);
    pOVar10 = (ON_Plane *)((long)pOVar10 + (ulong)bVar13 * -0x10 + 8);
  }
  content_version = -1;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(archive,&content_version);
  if (!bVar1) {
    return false;
  }
  if (-1 < content_version) {
    this_00 = (ON_TextContent *)operator_new(0xd8);
    ON_TextContent::ON_TextContent(this_00);
    iVar4 = (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0xb])(this_00,archive);
    if ((char)iVar4 == '\0') {
      (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_00);
    }
    else {
      this->m_text = this_00;
      bVar1 = ON_BinaryArchive::Read3dmReferencedComponentId(archive,DimStyle,&this->m_dimstyle_id);
      if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadPlane(archive,&this->m_plane), bVar1)) {
        if (content_version < 1) {
          bVar1 = true;
          goto LAB_003b25d2;
        }
        u = 0;
        bVar1 = ON_BinaryArchive::ReadInt(archive,&u);
        if (bVar1) {
          AVar2 = ON::AnnotationTypeFromUnsigned(u);
          AVar5 = this->m_annotation_type;
          if (AVar2 != AVar5) {
            puVar7 = &DAT_0069288d;
            pAVar9 = &DAT_0069288c;
            uVar11 = 0;
            while ((uVar11 < 3 && (pAVar12 = pAVar9, lVar6 = 2, AVar2 != AVar5))) {
              while (lVar6 != 0) {
                if ((*pAVar12 == AVar2) && (puVar7[lVar6 + -2] == AVar5)) {
                  this->m_annotation_type = AVar2;
                  AVar5 = AVar2;
                  break;
                }
                pAVar12 = pAVar12 + 1;
                lVar6 = lVar6 + -1;
              }
              uVar11 = uVar11 + 1;
              puVar7 = puVar7 + 2;
              pAVar9 = pAVar9 + 2;
            }
            if (AVar2 != AVar5) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_annotationbase.cpp"
                         ,0x1ce,"","Invalid annotation type.");
            }
          }
          bVar1 = ON_BinaryArchive::Internal_Read3dmDimStyleOverrides
                            (archive,this,content_version < 2);
          if (bVar1) {
            bVar1 = true;
            if (content_version < 3) goto LAB_003b25d2;
            bVar3 = ON_BinaryArchive::ReadVector(archive,&this->m_horizontal_direction);
            if (bVar3) {
              if (3 < content_version) {
                bVar1 = ON_BinaryArchive::ReadBool(archive,&this->m_allow_text_scaling);
              }
              goto LAB_003b25d2;
            }
          }
        }
      }
    }
  }
  bVar1 = false;
LAB_003b25d2:
  bVar3 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar3 & bVar1);
}

Assistant:

bool ON_Annotation::Internal_ReadAnnotation(
  ON_BinaryArchive& archive
  )
{
  Internal_Destroy();
  m_dimstyle_id = ON_nil_uuid;
  m_plane = ON_Plane::World_xy;
  // do not change the value of m_annotation_type
    
  int content_version = -1;
  if (false == archive.BeginRead3dmAnonymousChunk(&content_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (content_version < 0)
      break;
    
    ON_TextContent* text = new ON_TextContent;
    if (nullptr == text)
      break;
    if (false == text->Read(archive))
    {
      delete text;
      break;
    }
    m_text = text;

    if (!archive.Read3dmReferencedComponentId(ON_ModelComponent::Type::DimStyle, &m_dimstyle_id))
      break;

    if (!archive.ReadPlane(m_plane))
      break;

    if (content_version <= 0)
    {
      rc = true;
      break;
    }

    unsigned int u = 0;
    if (!archive.ReadInt(&u))
      break;
    const ON::AnnotationType annotation_type = ON::AnnotationTypeFromUnsigned(u);
    if (annotation_type != m_annotation_type)
    {
      const ON::AnnotationType annotation_type_pairs[3][2]
      {
        // ON_DimLinear linear dimensions can have type = Aligned or Rotated
        {ON::AnnotationType::Aligned,ON::AnnotationType::Rotated},

        // ON_DimRadial radial dimensions can have type = Diameter or Radius
        { ON::AnnotationType::Diameter,ON::AnnotationType::Radius },

        // ON_DimAngular radial dimensions can have type = Angular or Angular3pt
        { ON::AnnotationType::Angular,ON::AnnotationType::Angular3pt },
      };
      for (int pair_dex = 0; pair_dex < 3 && annotation_type != m_annotation_type; pair_dex++)
      {
        for (int k = 0; k < 2; k++)
        {
          if (
            annotation_type_pairs[pair_dex][k] == annotation_type
            && annotation_type_pairs[pair_dex][1-k] == m_annotation_type
            )
          {
            m_annotation_type = annotation_type;
            break;
          }
        }            
      }
      if (annotation_type != m_annotation_type)
      {
        ON_ERROR("Invalid annotation type.");
      }
    }

    // Dale Lear 2016 Dec 12 https://mcneel.myjetbrains.com/youtrack/issue/RH-37176
    // content_version incremented to 2.
    // optional override dimension style move from dimstyle table to annotation object
    const bool bFromDimStyleTable = content_version <= 1;
    if (!archive.Internal_Read3dmDimStyleOverrides(*this, bFromDimStyleTable))
      break;

    if (content_version <= 2)
    {
      rc = true;
      break;
    }

    // content_version = 3 ( 13 July, 2017 )
    if (!archive.ReadVector(m_horizontal_direction))
      break;

    if (content_version <= 3)
    {
      rc = true;
      break;
    }

    // content_version = 4 ( 17 May, 2018 - Lowell)
    if (!archive.ReadBool(&m_allow_text_scaling))
      break;

    rc = true;
    break;
  }
  if (!archive.EndRead3dmChunk())
    rc = false;

  return rc;
}